

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint getTreeInflateDynamic(HuffmanTree *tree_ll,HuffmanTree *tree_d,LodePNGBitReader *reader)

{
  uint uVar1;
  int iVar2;
  LodePNGBitReader *in_RDX;
  uint replength_2;
  uint replength_1;
  uint value;
  uint replength;
  uint code;
  HuffmanTree tree_cl;
  uint *bitlen_cl;
  uint *bitlen_d;
  uint *bitlen_ll;
  uint i;
  uint HCLEN;
  uint HDIST;
  uint HLIT;
  uint n;
  uint error;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  HuffmanTree local_78;
  void *local_50;
  void *local_48;
  void *local_40;
  uint local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  LodePNGBitReader *local_20;
  uint local_4;
  
  local_24 = 0;
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  local_50 = (void *)0x0;
  local_20 = in_RDX;
  uVar1 = ensureBits17(in_RDX,0xe);
  if (uVar1 == 0) {
    local_4 = 0x31;
  }
  else {
    local_2c = readBits((LodePNGBitReader *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
    local_2c = local_2c + 0x101;
    uVar1 = readBits((LodePNGBitReader *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
    local_30 = uVar1 + 1;
    local_34 = readBits((LodePNGBitReader *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
    local_34 = local_34 + 4;
    local_50 = lodepng_malloc(0x661621);
    if (local_50 == (void *)0x0) {
      local_4 = 0x53;
    }
    else {
      HuffmanTree_init(&local_78);
      if (local_24 == 0) {
        iVar2 = lodepng_gtofl(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff68);
        if (iVar2 == 0) {
          for (local_38 = 0; local_38 != local_34; local_38 = local_38 + 1) {
            ensureBits9(local_20,3);
            uVar1 = readBits((LodePNGBitReader *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff68);
            *(uint *)((long)local_50 + (ulong)CLCL_ORDER[local_38] * 4) = uVar1;
          }
          for (local_38 = local_34; local_38 != 0x13; local_38 = local_38 + 1) {
            *(undefined4 *)((long)local_50 + (ulong)CLCL_ORDER[local_38] * 4) = 0;
          }
          local_24 = HuffmanTree_makeFromLengths
                               ((HuffmanTree *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                (uint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),in_stack_ffffffffffffff68,0);
          if (local_24 == 0) {
            local_40 = lodepng_malloc(0x66174f);
            local_48 = lodepng_malloc(0x66175e);
            if ((local_40 == (void *)0x0) || (local_48 == (void *)0x0)) {
              local_24 = 0x53;
            }
            else {
              lodepng_memset(local_40,0,0x480);
              lodepng_memset(local_48,0,0x80);
              local_38 = 0;
              do {
                if (local_2c + local_30 <= local_38) goto LAB_00661a9b;
                ensureBits25(local_20,0x16);
                uVar1 = huffmanDecodeSymbol((LodePNGBitReader *)
                                            CONCAT44(in_stack_ffffffffffffff7c,
                                                     in_stack_ffffffffffffff78),
                                            (HuffmanTree *)
                                            CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70));
                if (uVar1 < 0x10) {
                  if (local_38 < local_2c) {
                    *(uint *)((long)local_40 + (ulong)local_38 * 4) = uVar1;
                  }
                  else {
                    *(uint *)((long)local_48 + (ulong)(local_38 - local_2c) * 4) = uVar1;
                  }
                  local_38 = local_38 + 1;
                }
                else if (uVar1 == 0x10) {
                  if (local_38 == 0) {
                    local_24 = 0x36;
                    goto LAB_00661a9b;
                  }
                  uVar1 = readBits((LodePNGBitReader *)
                                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff68);
                  if (local_38 < local_2c + 1) {
                    in_stack_ffffffffffffff7c =
                         *(undefined4 *)((long)local_40 + (ulong)(local_38 - 1) * 4);
                  }
                  else {
                    in_stack_ffffffffffffff7c =
                         *(undefined4 *)((long)local_48 + (ulong)((local_38 - local_2c) - 1) * 4);
                  }
                  for (local_28 = 0; local_28 < uVar1 + 3; local_28 = local_28 + 1) {
                    if (local_2c + local_30 <= local_38) {
                      local_24 = 0xd;
                      break;
                    }
                    if (local_38 < local_2c) {
                      *(undefined4 *)((long)local_40 + (ulong)local_38 * 4) =
                           in_stack_ffffffffffffff7c;
                    }
                    else {
                      *(undefined4 *)((long)local_48 + (ulong)(local_38 - local_2c) * 4) =
                           in_stack_ffffffffffffff7c;
                    }
                    local_38 = local_38 + 1;
                  }
                }
                else if (uVar1 == 0x11) {
                  iVar2 = 3;
                  in_stack_ffffffffffffff78 =
                       readBits((LodePNGBitReader *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff68);
                  in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + iVar2;
                  for (local_28 = 0; local_28 < in_stack_ffffffffffffff78; local_28 = local_28 + 1)
                  {
                    if (local_2c + local_30 <= local_38) {
                      local_24 = 0xe;
                      break;
                    }
                    if (local_38 < local_2c) {
                      *(undefined4 *)((long)local_40 + (ulong)local_38 * 4) = 0;
                    }
                    else {
                      *(undefined4 *)((long)local_48 + (ulong)(local_38 - local_2c) * 4) = 0;
                    }
                    local_38 = local_38 + 1;
                  }
                }
                else {
                  if (uVar1 != 0x12) {
                    local_24 = 0x10;
                    goto LAB_00661a9b;
                  }
                  iVar2 = 0xb;
                  in_stack_ffffffffffffff74 =
                       readBits((LodePNGBitReader *)CONCAT44(0xb,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff68);
                  in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + iVar2;
                  for (local_28 = 0; local_28 < in_stack_ffffffffffffff74; local_28 = local_28 + 1)
                  {
                    if (local_2c + local_30 <= local_38) {
                      local_24 = 0xf;
                      break;
                    }
                    if (local_38 < local_2c) {
                      *(undefined4 *)((long)local_40 + (ulong)local_38 * 4) = 0;
                    }
                    else {
                      *(undefined4 *)((long)local_48 + (ulong)(local_38 - local_2c) * 4) = 0;
                    }
                    local_38 = local_38 + 1;
                  }
                }
              } while (local_20->bp <= local_20->bitsize);
              local_24 = 0x32;
LAB_00661a9b:
              if (local_24 == 0) {
                if (*(int *)((long)local_40 + 0x400) == 0) {
                  local_24 = 0x40;
                }
                else {
                  local_24 = HuffmanTree_makeFromLengths
                                       ((HuffmanTree *)
                                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ),
                                        (uint *)CONCAT44(in_stack_ffffffffffffff74,
                                                         in_stack_ffffffffffffff70),
                                        in_stack_ffffffffffffff68,0);
                  if (local_24 == 0) {
                    local_24 = HuffmanTree_makeFromLengths
                                         ((HuffmanTree *)
                                          CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78),
                                          (uint *)CONCAT44(in_stack_ffffffffffffff74,
                                                           in_stack_ffffffffffffff70),
                                          in_stack_ffffffffffffff68,0);
                  }
                }
              }
            }
          }
        }
        else {
          local_24 = 0x32;
        }
      }
      lodepng_free((void *)0x661b0f);
      lodepng_free((void *)0x661b19);
      lodepng_free((void *)0x661b23);
      HuffmanTree_cleanup((HuffmanTree *)0x661b2d);
      local_4 = local_24;
    }
  }
  return local_4;
}

Assistant:

static unsigned getTreeInflateDynamic(HuffmanTree* tree_ll, HuffmanTree* tree_d,
                                      LodePNGBitReader* reader) {
  /*make sure that length values that aren't filled in will be 0, or a wrong tree will be generated*/
  unsigned error = 0;
  unsigned n, HLIT, HDIST, HCLEN, i;

  /*see comments in deflateDynamic for explanation of the context and these variables, it is analogous*/
  unsigned* bitlen_ll = 0; /*lit,len code lengths*/
  unsigned* bitlen_d = 0; /*dist code lengths*/
  /*code length code lengths ("clcl"), the bit lengths of the huffman tree used to compress bitlen_ll and bitlen_d*/
  unsigned* bitlen_cl = 0;
  HuffmanTree tree_cl; /*the code tree for code length codes (the huffman tree for compressed huffman trees)*/

  if(!ensureBits17(reader, 14)) return 49; /*error: the bit pointer is or will go past the memory*/

  /*number of literal/length codes + 257. Unlike the spec, the value 257 is added to it here already*/
  HLIT =  readBits(reader, 5) + 257;
  /*number of distance codes. Unlike the spec, the value 1 is added to it here already*/
  HDIST = readBits(reader, 5) + 1;
  /*number of code length codes. Unlike the spec, the value 4 is added to it here already*/
  HCLEN = readBits(reader, 4) + 4;

  bitlen_cl = (unsigned*)lodepng_malloc(NUM_CODE_LENGTH_CODES * sizeof(unsigned));
  if(!bitlen_cl) return 83 /*alloc fail*/;

  HuffmanTree_init(&tree_cl);

  while(!error) {
    /*read the code length codes out of 3 * (amount of code length codes) bits*/
    if(lodepng_gtofl(reader->bp, HCLEN * 3, reader->bitsize)) {
      ERROR_BREAK(50); /*error: the bit pointer is or will go past the memory*/
    }
    for(i = 0; i != HCLEN; ++i) {
      ensureBits9(reader, 3); /*out of bounds already checked above */
      bitlen_cl[CLCL_ORDER[i]] = readBits(reader, 3);
    }
    for(i = HCLEN; i != NUM_CODE_LENGTH_CODES; ++i) {
      bitlen_cl[CLCL_ORDER[i]] = 0;
    }

    error = HuffmanTree_makeFromLengths(&tree_cl, bitlen_cl, NUM_CODE_LENGTH_CODES, 7);
    if(error) break;

    /*now we can use this tree to read the lengths for the tree that this function will return*/
    bitlen_ll = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
    bitlen_d = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
    if(!bitlen_ll || !bitlen_d) ERROR_BREAK(83 /*alloc fail*/);
    lodepng_memset(bitlen_ll, 0, NUM_DEFLATE_CODE_SYMBOLS * sizeof(*bitlen_ll));
    lodepng_memset(bitlen_d, 0, NUM_DISTANCE_SYMBOLS * sizeof(*bitlen_d));

    /*i is the current symbol we're reading in the part that contains the code lengths of lit/len and dist codes*/
    i = 0;
    while(i < HLIT + HDIST) {
      unsigned code;
      ensureBits25(reader, 22); /* up to 15 bits for huffman code, up to 7 extra bits below*/
      code = huffmanDecodeSymbol(reader, &tree_cl);
      if(code <= 15) /*a length code*/ {
        if(i < HLIT) bitlen_ll[i] = code;
        else bitlen_d[i - HLIT] = code;
        ++i;
      } else if(code == 16) /*repeat previous*/ {
        unsigned replength = 3; /*read in the 2 bits that indicate repeat length (3-6)*/
        unsigned value; /*set value to the previous code*/

        if(i == 0) ERROR_BREAK(54); /*can't repeat previous if i is 0*/

        replength += readBits(reader, 2);

        if(i < HLIT + 1) value = bitlen_ll[i - 1];
        else value = bitlen_d[i - HLIT - 1];
        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n) {
          if(i >= HLIT + HDIST) ERROR_BREAK(13); /*error: i is larger than the amount of codes*/
          if(i < HLIT) bitlen_ll[i] = value;
          else bitlen_d[i - HLIT] = value;
          ++i;
        }
      } else if(code == 17) /*repeat "0" 3-10 times*/ {
        unsigned replength = 3; /*read in the bits that indicate repeat length*/
        replength += readBits(reader, 3);

        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n) {
          if(i >= HLIT + HDIST) ERROR_BREAK(14); /*error: i is larger than the amount of codes*/

          if(i < HLIT) bitlen_ll[i] = 0;
          else bitlen_d[i - HLIT] = 0;
          ++i;
        }
      } else if(code == 18) /*repeat "0" 11-138 times*/ {
        unsigned replength = 11; /*read in the bits that indicate repeat length*/
        replength += readBits(reader, 7);

        /*repeat this value in the next lengths*/
        for(n = 0; n < replength; ++n) {
          if(i >= HLIT + HDIST) ERROR_BREAK(15); /*error: i is larger than the amount of codes*/

          if(i < HLIT) bitlen_ll[i] = 0;
          else bitlen_d[i - HLIT] = 0;
          ++i;
        }
      } else /*if(code == INVALIDSYMBOL)*/ {
        ERROR_BREAK(16); /*error: tried to read disallowed huffman symbol*/
      }
      /*check if any of the ensureBits above went out of bounds*/
      if(reader->bp > reader->bitsize) {
        /*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
        (10=no endcode, 11=wrong jump outside of tree)*/
        /* TODO: revise error codes 10,11,50: the above comment is no longer valid */
        ERROR_BREAK(50); /*error, bit pointer jumps past memory*/
      }
    }
    if(error) break;

    if(bitlen_ll[256] == 0) ERROR_BREAK(64); /*the length of the end code 256 must be larger than 0*/

    /*now we've finally got HLIT and HDIST, so generate the code trees, and the function is done*/
    error = HuffmanTree_makeFromLengths(tree_ll, bitlen_ll, NUM_DEFLATE_CODE_SYMBOLS, 15);
    if(error) break;
    error = HuffmanTree_makeFromLengths(tree_d, bitlen_d, NUM_DISTANCE_SYMBOLS, 15);

    break; /*end of error-while*/
  }

  lodepng_free(bitlen_cl);
  lodepng_free(bitlen_ll);
  lodepng_free(bitlen_d);
  HuffmanTree_cleanup(&tree_cl);

  return error;
}